

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O2

void BrotliSplitBlock(MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
                     size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  int *piVar1;
  long *plVar2;
  ushort uVar3;
  uint uVar4;
  byte bVar5;
  ushort uVar6;
  size_t sVar7;
  uint8_t *puVar8;
  uint32_t *puVar9;
  HistogramLiteral *pHVar10;
  uint32_t *__dest;
  void *pvVar11;
  uint16_t *puVar12;
  void *pvVar13;
  HistogramCommand *pHVar14;
  ulong uVar15;
  ushort *puVar16;
  void *pvVar17;
  double *pdVar18;
  void *pvVar19;
  void *pvVar20;
  long lVar21;
  void *pvVar22;
  HistogramDistance *out;
  ulong uVar23;
  ulong uVar24;
  HistogramDistance *pHVar25;
  Command *pCVar26;
  size_t sVar27;
  long lVar28;
  ulong uVar29;
  char *pcVar30;
  int iVar31;
  byte *pbVar32;
  uint *puVar33;
  ulong uVar34;
  double *pdVar35;
  long lVar36;
  byte bVar37;
  uint32_t uVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  size_t __n;
  long lVar42;
  size_t __n_00;
  long lVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  bool bVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  HistogramCommand *local_1000;
  HistogramDistance *local_ff8;
  HistogramCommand *local_ff0;
  uint32_t *local_fe0;
  ulong local_fd8;
  uint32_t *local_fd0;
  HistogramLiteral *local_fc8;
  uint32_t *local_fc0;
  ulong local_fb8;
  uint32_t *local_fb0;
  uint32_t *local_fa8;
  uint32_t *local_f90;
  ulong local_f80;
  HistogramPair *local_f78;
  HistogramPair *local_f68;
  HistogramPair *local_f58;
  long local_f50;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  undefined1 local_b40 [2080];
  ulong local_320;
  double local_318;
  ulong local_40;
  double local_38;
  
  sVar40 = 0;
  sVar7 = num_commands;
  pCVar26 = cmds;
  while (bVar47 = sVar7 != 0, sVar7 = sVar7 - 1, bVar47) {
    sVar40 = sVar40 + pCVar26->insert_len_;
    pCVar26 = pCVar26 + 1;
  }
  if (sVar40 == 0) {
    local_fd0 = (uint32_t *)0x0;
  }
  else {
    local_fd0 = (uint32_t *)BrotliAllocate(m,sVar40);
  }
  puVar9 = &cmds->copy_len_;
  lVar43 = 0;
  sVar7 = num_commands;
  while (bVar47 = sVar7 != 0, sVar7 = sVar7 - 1, bVar47) {
    uVar46 = pos & mask;
    __n = (size_t)((Command *)(puVar9 + -1))->insert_len_;
    if (mask < uVar46 + __n) {
      __n_00 = (mask + 1) - uVar46;
      memcpy((void *)((long)local_fd0 + lVar43),data + uVar46,__n_00);
      lVar43 = lVar43 + __n_00;
      __n = __n - __n_00;
      uVar46 = 0;
    }
    if (__n != 0) {
      memcpy((void *)((long)local_fd0 + lVar43),data + uVar46,__n);
      lVar43 = lVar43 + __n;
    }
    pos = (ulong)(*puVar9 & 0xffffff) + __n + uVar46;
    puVar9 = puVar9 + 4;
  }
  uVar46 = 100;
  if (sVar40 < 0xd480) {
    uVar46 = (ulong)(ushort)((ushort)sVar40 / 0x220 + 1);
  }
  local_f50 = 3;
  if (sVar40 == 0) {
    literal_split->num_types = 1;
  }
  else {
    if (0x7f < sVar40) {
      uVar39 = 7;
      pvVar11 = BrotliAllocate(m,uVar46 * 0x410);
      for (lVar43 = 0; uVar46 * 0x410 - lVar43 != 0; lVar43 = lVar43 + 0x410) {
        memset((void *)((long)pvVar11 + lVar43),0,0x408);
        *(undefined8 *)((long)pvVar11 + lVar43 + 0x408) = 0x7ff0000000000000;
      }
      for (uVar41 = 0; uVar41 != uVar46; uVar41 = uVar41 + 1) {
        uVar15 = (uVar41 * sVar40) / uVar46;
        if (uVar41 != 0) {
          iVar31 = (int)uVar39;
          uVar39 = (ulong)(uint)(iVar31 * 0x41a7);
          if (iVar31 == 0) {
            uVar39 = 1;
          }
          uVar15 = uVar15 + uVar39 % (sVar40 / uVar46);
        }
        if (sVar40 <= uVar15 + 0x46) {
          uVar15 = sVar40 - 0x47;
        }
        plVar2 = (long *)((long)pvVar11 + uVar41 * 0x410 + 0x400);
        *plVar2 = *plVar2 + 0x46;
        for (lVar43 = -0x46; lVar43 != 0; lVar43 = lVar43 + 1) {
          piVar1 = (int *)((long)pvVar11 +
                          (ulong)*(byte *)((long)local_fd0 + lVar43 + uVar15 + 0x46) * 4 +
                          uVar41 * 0x410);
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar15 = (sVar40 * 2) / 0x46 + uVar46 + 99;
      uVar39 = 7;
      for (uVar41 = 0; uVar41 < uVar15 - uVar15 % uVar46; uVar41 = uVar41 + 1) {
        memset(local_b40,0,0x408);
        iVar31 = (int)uVar39;
        uVar39 = (ulong)(uint)(iVar31 * 0x41a7);
        if (iVar31 == 0) {
          uVar39 = 1;
        }
        pbVar32 = (byte *)(uVar39 % (sVar40 - 0x45) + (long)local_fd0);
        for (lVar43 = -0x46; lVar43 != 0; lVar43 = lVar43 + 1) {
          bVar5 = *pbVar32;
          pbVar32 = pbVar32 + 1;
          *(int *)(local_b40 + (ulong)bVar5 * 4) = *(int *)(local_b40 + (ulong)bVar5 * 4) + 1;
        }
        lVar43 = (uVar41 % uVar46) * 0x410;
        plVar2 = (long *)((long)pvVar11 + lVar43 + 0x400);
        *plVar2 = *plVar2 + 0x46;
        for (lVar28 = 0; lVar28 != 0x100; lVar28 = lVar28 + 1) {
          piVar1 = (int *)((long)pvVar11 + lVar28 * 4 + lVar43);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar28 * 4);
        }
      }
      pvVar17 = BrotliAllocate(m,sVar40);
      iVar31 = (int)uVar46;
      pdVar18 = (double *)BrotliAllocate(m,(ulong)(uint)(iVar31 << 0xb));
      pvVar19 = BrotliAllocate(m,(ulong)(uint)(iVar31 * 8));
      sVar7 = (iVar31 + 7U >> 3) * sVar40;
      if (sVar7 == 0) {
        local_f90 = (uint32_t *)0x0;
      }
      else {
        local_f90 = (uint32_t *)BrotliAllocate(m,sVar7);
      }
      pvVar20 = BrotliAllocate(m,(ulong)(uint)(iVar31 * 2));
      lVar43 = 3;
      if (10 < params->quality) {
        lVar43 = 10;
      }
      local_fe0 = (uint32_t *)0x0;
      for (lVar28 = 0; lVar28 != lVar43; lVar28 = lVar28 + 1) {
        if (uVar46 < 2) {
          for (sVar7 = 0; sVar40 != sVar7; sVar7 = sVar7 + 1) {
            *(undefined1 *)((long)pvVar17 + sVar7) = 0;
          }
          local_fe0 = (uint32_t *)0x1;
        }
        else {
          uVar39 = uVar46 + 7 >> 3;
          memset(pdVar18,0,uVar46 << 0xb);
          puVar33 = (uint *)((long)pvVar11 + 0x400);
          for (uVar41 = 0; uVar46 != uVar41; uVar41 = uVar41 + 1) {
            uVar15 = (ulong)*puVar33;
            if (uVar15 < 0x100) {
              dVar48 = (double)kLog2Table[uVar15];
            }
            else {
              dVar48 = log2((double)uVar15);
            }
            pdVar18[uVar41] = dVar48;
            puVar33 = puVar33 + 0x104;
          }
          lVar42 = uVar46 * 0x7f8;
          lVar44 = 0x100;
          lVar21 = (long)pvVar11 + 0x3fc;
          while (bVar47 = lVar44 != 0, lVar44 = lVar44 + -1, bVar47) {
            pdVar35 = pdVar18;
            for (lVar36 = 0; uVar46 * 0x82 - lVar36 != 0; lVar36 = lVar36 + 0x82) {
              dVar48 = *pdVar35;
              uVar4 = *(uint *)(lVar21 + lVar36 * 8);
              uVar41 = (ulong)uVar4;
              dVar49 = -2.0;
              if (uVar41 != 0) {
                if (uVar4 < 0x100) {
                  dVar49 = (double)kLog2Table[uVar41];
                }
                else {
                  dVar49 = log2((double)uVar41);
                }
              }
              *(double *)((long)pdVar35 + lVar42) = dVar48 - dVar49;
              pdVar35 = pdVar35 + 1;
            }
            lVar42 = lVar42 + uVar46 * -8;
            lVar21 = lVar21 + -4;
          }
          memset(pvVar19,0,uVar46 * 8);
          memset(local_f90,0,uVar39 * sVar40);
          for (uVar41 = 0; uVar41 != sVar40; uVar41 = uVar41 + 1) {
            bVar5 = *(byte *)((long)local_fd0 + uVar41);
            dVar48 = 1e+99;
            for (uVar15 = 0; uVar46 != uVar15; uVar15 = uVar15 + 1) {
              dVar49 = pdVar18[bVar5 * uVar46 + uVar15] + *(double *)((long)pvVar19 + uVar15 * 8);
              *(double *)((long)pvVar19 + uVar15 * 8) = dVar49;
              if (dVar49 < dVar48) {
                *(char *)((long)pvVar17 + uVar41) = (char)uVar15;
                dVar48 = dVar49;
              }
            }
            dVar49 = 28.1;
            if (uVar41 < 2000) {
              dVar49 = (((double)(long)uVar41 * 0.07) / 2000.0 + 0.77) * 28.1;
            }
            for (uVar15 = 0; uVar46 != uVar15; uVar15 = uVar15 + 1) {
              dVar50 = *(double *)((long)pvVar19 + uVar15 * 8) - dVar48;
              *(double *)((long)pvVar19 + uVar15 * 8) = dVar50;
              if (dVar49 <= dVar50) {
                *(double *)((long)pvVar19 + uVar15 * 8) = dVar49;
                if (uVar39 <= uVar15 >> 3) {
                  pcVar30 = 
                  "size_t FindBlocksLiteral(const uint8_t *, const size_t, const double, const size_t, const HistogramLiteral *, double *, double *, uint8_t *, uint8_t *)"
                  ;
                  goto LAB_00114286;
                }
                pbVar32 = (byte *)((long)local_f90 + (uVar15 >> 3) + uVar41 * uVar39);
                *pbVar32 = *pbVar32 | '\x01' << ((byte)uVar15 & 7);
              }
            }
          }
          bVar5 = *(byte *)((long)pvVar17 + (sVar40 - 1));
          pvVar22 = (void *)((sVar40 - 2) * uVar39 + (long)local_f90);
          local_fe0 = (uint32_t *)0x1;
          for (sVar7 = sVar40; sVar7 != 1; sVar7 = sVar7 - 1) {
            if (uVar39 <= bVar5 >> 3) {
              pcVar30 = 
              "size_t FindBlocksLiteral(const uint8_t *, const size_t, const double, const size_t, const HistogramLiteral *, double *, double *, uint8_t *, uint8_t *)"
              ;
              goto LAB_0011436d;
            }
            if ((*(byte *)((long)pvVar22 + (ulong)(bVar5 >> 3)) >> (bVar5 & 7) & 1) != 0) {
              bVar37 = *(byte *)((long)pvVar17 + (sVar7 - 2));
              local_fe0 = (uint32_t *)((long)local_fe0 + (ulong)(bVar5 != bVar37));
              bVar5 = bVar37;
            }
            *(byte *)((long)pvVar17 + (sVar7 - 2)) = bVar5;
            pvVar22 = (void *)((long)pvVar22 - uVar39);
          }
        }
        for (uVar39 = 0; uVar46 != uVar39; uVar39 = uVar39 + 1) {
          *(undefined2 *)((long)pvVar20 + uVar39 * 2) = 0x100;
        }
        uVar6 = 0;
        for (sVar7 = 0; sVar40 != sVar7; sVar7 = sVar7 + 1) {
          uVar39 = (ulong)*(byte *)((long)pvVar17 + sVar7);
          if (uVar46 <= uVar39) {
            pcVar30 = 
            "size_t RemapBlockIdsLiteral(uint8_t *, const size_t, uint16_t *, const size_t)";
            goto LAB_00114301;
          }
          if (*(short *)((long)pvVar20 + uVar39 * 2) == 0x100) {
            *(ushort *)((long)pvVar20 + uVar39 * 2) = uVar6;
            uVar6 = uVar6 + 1;
          }
        }
        sVar7 = 0;
        while (sVar40 != sVar7) {
          uVar3 = *(ushort *)((long)pvVar20 + (ulong)*(byte *)((long)pvVar17 + sVar7) * 2);
          *(char *)((long)pvVar17 + sVar7) = (char)uVar3;
          sVar7 = sVar7 + 1;
          if ((ushort)uVar46 <= (uVar3 & 0xff)) {
            pcVar30 = 
            "size_t RemapBlockIdsLiteral(uint8_t *, const size_t, uint16_t *, const size_t)";
            goto LAB_00114320;
          }
        }
        uVar39 = (ulong)uVar6;
        if (uVar46 < uVar39) {
          pcVar30 = "size_t RemapBlockIdsLiteral(uint8_t *, const size_t, uint16_t *, const size_t)"
          ;
          goto LAB_0011445d;
        }
        for (lVar21 = 0; uVar39 * 0x410 - lVar21 != 0; lVar21 = lVar21 + 0x410) {
          memset((void *)(lVar21 + (long)pvVar11),0,0x408);
          *(undefined8 *)((long)pvVar11 + lVar21 + 0x408) = 0x7ff0000000000000;
        }
        for (sVar7 = 0; sVar40 != sVar7; sVar7 = sVar7 + 1) {
          lVar21 = (ulong)*(byte *)((long)pvVar17 + sVar7) * 0x410;
          piVar1 = (int *)((long)pvVar11 + (ulong)*(byte *)((long)local_fd0 + sVar7) * 4 + lVar21);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar11 + lVar21 + 0x400);
          *plVar2 = *plVar2 + 1;
        }
        uVar46 = uVar39;
      }
      BrotliFree(m,pdVar18);
      BrotliFree(m,pvVar19);
      BrotliFree(m,local_f90);
      BrotliFree(m,pvVar20);
      BrotliFree(m,pvVar11);
      if (local_fe0 == (uint32_t *)0x0) {
        local_fb0 = (uint32_t *)0x0;
        pvVar11 = (void *)0x0;
      }
      else {
        local_fb0 = (uint32_t *)BrotliAllocate(m,(long)local_fe0 * 4);
        pvVar11 = BrotliAllocate(m,(long)local_fe0 * 4);
      }
      uVar46 = (long)local_fe0 * 0x10 + 0x3f0;
      local_f68 = (HistogramPair *)(uVar46 >> 6);
      if (uVar46 < 0x40) {
        local_fc8 = (HistogramLiteral *)0x0;
        local_f90 = (uint32_t *)0x0;
      }
      else {
        local_fc8 = (HistogramLiteral *)BrotliAllocate(m,(long)local_f68 * 0x410);
        local_f90 = (uint32_t *)BrotliAllocate(m,(long)local_f68 * 4);
      }
      if (local_fe0 == (uint32_t *)0x0) {
        local_ff0 = (HistogramCommand *)0x0;
      }
      else {
        puVar9 = (uint32_t *)0x40;
        if (local_fe0 < 0x40) {
          puVar9 = local_fe0;
        }
        local_ff0 = (HistogramCommand *)BrotliAllocate(m,(long)puVar9 * 0x410);
      }
      local_f58 = (HistogramPair *)BrotliAllocate(m,0xc018);
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar11,0,(long)local_fe0 * 4);
      uVar46 = 0;
      sVar7 = 0;
      while (sVar27 = sVar7 + 1, sVar27 - sVar40 != 1) {
        if (local_fe0 <= uVar46) {
          pcVar30 = 
          "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_0011441f;
        }
        piVar1 = (int *)((long)pvVar11 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        if ((sVar27 == sVar40) ||
           (pcVar30 = (char *)((long)pvVar17 + sVar7), sVar7 = sVar27,
           *pcVar30 != *(char *)((long)pvVar17 + sVar27))) {
          uVar46 = uVar46 + 1;
          sVar7 = sVar27;
        }
      }
      if ((uint32_t *)uVar46 != local_fe0) {
        pcVar30 = 
        "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
        ;
        goto LAB_001144aa;
      }
      local_ff8 = (HistogramDistance *)0x0;
      local_fc0 = local_fb0;
      uVar39 = 0;
      uVar46 = 0;
      puVar9 = local_fe0;
      local_f80 = (ulong)local_f68;
      while( true ) {
        uVar41 = 0x40;
        if (puVar9 < 0x40) {
          uVar41 = (ulong)puVar9;
        }
        uVar15 = (long)local_fe0 - uVar39;
        if (local_fe0 < uVar39 || uVar15 == 0) {
          BrotliFree(m,local_ff0);
          uVar39 = (uVar46 >> 1) * uVar46;
          if (uVar46 << 6 < uVar39) {
            uVar39 = uVar46 << 6;
          }
          if (0x800 < uVar39) {
            BrotliFree(m,local_f58);
            local_f58 = (HistogramPair *)BrotliAllocate(m,uVar39 * 0x18 + 0x18);
          }
          if (uVar46 == 0) {
            puVar9 = (uint32_t *)0x0;
          }
          else {
            puVar9 = (uint32_t *)BrotliAllocate(m,uVar46 * 4);
          }
          for (uVar41 = 0; uVar46 != uVar41; uVar41 = uVar41 + 1) {
            puVar9[uVar41] = (uint32_t)uVar41;
          }
          sVar7 = BrotliHistogramCombineLiteral
                            (local_fc8,local_f90,local_fb0,puVar9,local_f58,uVar46,(size_t)local_fe0
                             ,0x100,uVar39);
          BrotliFree(m,local_f58);
          BrotliFree(m,local_f90);
          if (uVar46 == 0) {
            pvVar19 = (void *)0x0;
          }
          else {
            pvVar19 = BrotliAllocate(m,uVar46 * 4);
          }
          for (uVar39 = 0; uVar46 != uVar39; uVar39 = uVar39 + 1) {
            *(undefined4 *)((long)pvVar19 + uVar39 * 4) = 0xffffffff;
          }
          local_ff8 = (HistogramDistance *)0x0;
          iVar31 = 0;
          for (uVar46 = 0; (uint32_t *)uVar46 != local_fe0; uVar46 = uVar46 + 1) {
            memset(local_b40,0,0x408);
            local_b40._1032_8_ = INFINITY;
            uVar39 = 0;
            while (uVar39 < *(uint *)((long)pvVar11 + uVar46 * 4)) {
              *(int *)(local_b40 + (ulong)*(byte *)((long)local_fd0 + uVar39 + (long)local_ff8) * 4)
                   = *(int *)(local_b40 +
                             (ulong)*(byte *)((long)local_fd0 + uVar39 + (long)local_ff8) * 4) + 1;
              uVar39 = uVar39 + 1;
              local_b40._1024_8_ = uVar39;
            }
            lVar43 = uVar46 - 1;
            if (uVar46 == 0) {
              lVar43 = 0;
            }
            uVar41 = (ulong)local_fb0[lVar43];
            local_ff0 = (HistogramCommand *)
                        BrotliHistogramBitCostDistanceLiteral
                                  ((HistogramLiteral *)local_b40,local_fc8 + uVar41);
            local_ff8 = (HistogramDistance *)((long)local_ff8 + uVar39);
            for (sVar40 = 0; sVar7 != sVar40; sVar40 = sVar40 + 1) {
              dVar48 = BrotliHistogramBitCostDistanceLiteral
                                 ((HistogramLiteral *)local_b40,local_fc8 + puVar9[sVar40]);
              if (dVar48 < (double)local_ff0) {
                uVar41 = (ulong)puVar9[sVar40];
                local_ff0 = (HistogramCommand *)dVar48;
              }
            }
            local_fb0[uVar46] = (uint32_t)uVar41;
            if (*(int *)((long)pvVar19 + uVar41 * 4) == -1) {
              *(int *)((long)pvVar19 + uVar41 * 4) = iVar31;
              iVar31 = iVar31 + 1;
            }
          }
          BrotliFree(m,puVar9);
          BrotliFree(m,local_fc8);
          puVar9 = (uint32_t *)literal_split->types_alloc_size;
          if (puVar9 < local_fe0) {
            if (puVar9 == (uint32_t *)0x0) {
              puVar9 = local_fe0;
            }
            do {
              uVar46 = (ulong)puVar9;
              puVar9 = (uint32_t *)(uVar46 * 2);
            } while (uVar46 < local_fe0);
            puVar8 = (uint8_t *)BrotliAllocate(m,uVar46);
            if (literal_split->types_alloc_size != 0) {
              memcpy(puVar8,literal_split->types,literal_split->types_alloc_size);
            }
            BrotliFree(m,literal_split->types);
            literal_split->types = puVar8;
            literal_split->types_alloc_size = uVar46;
          }
          puVar9 = (uint32_t *)literal_split->lengths_alloc_size;
          if (puVar9 < local_fe0) {
            if (puVar9 == (uint32_t *)0x0) {
              puVar9 = local_fe0;
            }
            do {
              uVar46 = (ulong)puVar9;
              puVar9 = (uint32_t *)(uVar46 * 2);
            } while (uVar46 < local_fe0);
            puVar9 = (uint32_t *)BrotliAllocate(m,uVar46 * 4);
            if (literal_split->lengths_alloc_size != 0) {
              memcpy(puVar9,literal_split->lengths,literal_split->lengths_alloc_size << 2);
            }
            BrotliFree(m,literal_split->lengths);
            literal_split->lengths = puVar9;
            literal_split->lengths_alloc_size = uVar46;
          }
          uVar46 = 0;
          uVar39 = 0;
          sVar7 = 0;
          do {
            uVar38 = 0;
            uVar41 = uVar39;
            do {
              uVar39 = uVar41 + 1;
              uVar15 = uVar46 & 0xff;
              if (uVar39 - (long)local_fe0 == 1) {
                literal_split->num_blocks = sVar7;
                literal_split->num_types = uVar15 + 1;
                BrotliFree(m,pvVar19);
                BrotliFree(m,pvVar11);
                BrotliFree(m,local_fb0);
                BrotliFree(m,pvVar17);
                goto LAB_00111e84;
              }
              uVar38 = uVar38 + *(int *)((long)pvVar11 + uVar39 * 4 + -4);
              puVar33 = local_fb0 + uVar41;
            } while (((uint32_t *)uVar39 != local_fe0) &&
                    (uVar41 = uVar39, *puVar33 == local_fb0[uVar39]));
            uVar4 = *(uint *)((long)pvVar19 + (ulong)*puVar33 * 4);
            bVar5 = (byte)uVar4;
            literal_split->types[sVar7] = bVar5;
            literal_split->lengths[sVar7] = uVar38;
            bVar37 = (byte)uVar46;
            uVar46 = (ulong)uVar4;
            if (bVar5 < bVar37) {
              uVar46 = uVar15;
            }
            sVar7 = sVar7 + 1;
          } while( true );
        }
        for (uVar23 = 0; uVar23 != uVar41; uVar23 = uVar23 + 1) {
          pHVar10 = (HistogramLiteral *)((long)local_ff0 + uVar23 * 0x410);
          memset(pHVar10,0,0x408);
          ((HistogramLiteral *)((long)local_ff0 + uVar23 * 0x410))->bit_cost_ = INFINITY;
          uVar29 = 0;
          while (uVar29 < *(uint *)((long)pvVar11 + (uVar39 + uVar23) * 4)) {
            pHVar10->data_[*(byte *)((long)local_fd0 + uVar29 + (long)local_ff8)] =
                 pHVar10->data_[*(byte *)((long)local_fd0 + uVar29 + (long)local_ff8)] + 1;
            uVar29 = uVar29 + 1;
            pHVar10->total_count_ = uVar29;
          }
          dVar48 = BrotliPopulationCostLiteral(pHVar10);
          pHVar10->bit_cost_ = dVar48;
          new_clusters[uVar23] = (uint32_t)uVar23;
          symbols[uVar23] = (uint32_t)uVar23;
          sizes[uVar23] = 1;
          local_ff8 = (HistogramDistance *)((long)local_ff8 + uVar29);
        }
        if (0x3f < uVar15) {
          uVar15 = 0x40;
        }
        sVar7 = BrotliHistogramCombineLiteral
                          ((HistogramLiteral *)local_ff0,sizes,symbols,new_clusters,local_f58,uVar15
                           ,uVar15,0x40,0x800);
        uVar15 = sVar7 + uVar46;
        if (local_f68 < uVar15) {
          uVar23 = (ulong)local_f68;
          if (local_f68 == (HistogramPair *)0x0) {
            uVar23 = uVar15;
          }
          do {
            uVar29 = uVar23;
            uVar23 = uVar29 * 2;
          } while (uVar29 < uVar15);
          pHVar10 = (HistogramLiteral *)BrotliAllocate(m,uVar29 * 0x410);
          if (local_f68 != (HistogramPair *)0x0) {
            memcpy(pHVar10,local_fc8,(long)local_f68 * 0x410);
          }
          BrotliFree(m,local_fc8);
          local_fc8 = pHVar10;
          local_f68 = (HistogramPair *)uVar29;
        }
        if (local_f80 < uVar15) {
          uVar23 = local_f80;
          if (local_f80 == 0) {
            uVar23 = uVar15;
          }
          do {
            uVar29 = uVar23;
            uVar23 = uVar29 * 2;
          } while (uVar29 < uVar15);
          __dest = (uint32_t *)BrotliAllocate(m,uVar29 * 4);
          if (local_f80 != 0) {
            memcpy(__dest,local_f90,local_f80 << 2);
          }
          BrotliFree(m,local_f90);
          local_f90 = __dest;
          local_f80 = uVar29;
        }
        pHVar10 = local_fc8 + uVar46;
        for (sVar40 = 0; sVar7 != sVar40; sVar40 = sVar40 + 1) {
          uVar4 = new_clusters[sVar40];
          memcpy(pHVar10,(HistogramLiteral *)((long)local_ff0 + (ulong)uVar4 * 0x410),0x410);
          local_f90[uVar46 + sVar40] = sizes[uVar4];
          remap[new_clusters[sVar40]] = (uint32_t)sVar40;
          pHVar10 = pHVar10 + 1;
        }
        for (uVar23 = 0; uVar41 != uVar23; uVar23 = uVar23 + 1) {
          local_fc0[uVar23] = remap[symbols[uVar23]] + (int)uVar46;
        }
        if (sVar7 != sVar40) break;
        uVar39 = uVar39 + 0x40;
        puVar9 = (uint32_t *)((long)puVar9 - 0x40);
        local_fc0 = local_fc0 + 0x40;
        uVar46 = uVar15;
      }
      pcVar30 = 
      "void ClusterBlocksLiteral(MemoryManager *, const uint8_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
      ;
      goto LAB_0011443e;
    }
    sVar7 = literal_split->num_blocks;
    uVar39 = literal_split->types_alloc_size;
    uVar46 = sVar7 + 1;
    if (uVar39 < uVar46) {
      if (uVar39 == 0) {
        uVar39 = uVar46;
      }
      do {
        uVar41 = uVar39;
        uVar39 = uVar41 * 2;
      } while (uVar41 < uVar46);
      puVar8 = (uint8_t *)BrotliAllocate(m,uVar41);
      if (literal_split->types_alloc_size != 0) {
        memcpy(puVar8,literal_split->types,literal_split->types_alloc_size);
      }
      BrotliFree(m,literal_split->types);
      literal_split->types = puVar8;
      literal_split->types_alloc_size = uVar41;
      sVar7 = literal_split->num_blocks;
      uVar46 = sVar7 + 1;
    }
    uVar39 = literal_split->lengths_alloc_size;
    if (uVar39 < uVar46) {
      if (uVar39 == 0) {
        uVar39 = uVar46;
      }
      do {
        uVar41 = uVar39;
        uVar39 = uVar41 * 2;
      } while (uVar41 < uVar46);
      puVar9 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
      if (literal_split->lengths_alloc_size != 0) {
        memcpy(puVar9,literal_split->lengths,literal_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,literal_split->lengths);
      literal_split->lengths = puVar9;
      literal_split->lengths_alloc_size = uVar41;
      sVar7 = literal_split->num_blocks;
    }
    literal_split->num_types = 1;
    literal_split->types[sVar7] = '\0';
    sVar7 = literal_split->num_blocks;
    literal_split->lengths[sVar7] = (uint32_t)sVar40;
    literal_split->num_blocks = sVar7 + 1;
  }
LAB_00111e84:
  BrotliFree(m,local_fd0);
  if (num_commands == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = BrotliAllocate(m,num_commands * 2);
  }
  puVar12 = &cmds->cmd_prefix_;
  for (sVar7 = 0; num_commands != sVar7; sVar7 = sVar7 + 1) {
    *(uint16_t *)((long)pvVar11 + sVar7 * 2) = *puVar12;
    puVar12 = puVar12 + 8;
  }
  uVar46 = (ulong)(ushort)((ushort)num_commands / 0x212 + 1);
  if (0x6783 < num_commands) {
    uVar46 = 0x32;
  }
  if (num_commands == 0) {
    insert_and_copy_split->num_types = 1;
  }
  else {
    if (0x7f < num_commands) {
      pvVar17 = BrotliAllocate(m,uVar46 * 0xb10);
      for (lVar43 = 0; uVar46 * 0xb10 - lVar43 != 0; lVar43 = lVar43 + 0xb10) {
        memset((void *)(lVar43 + (long)pvVar17),0,0xb08);
        *(undefined8 *)((long)pvVar17 + lVar43 + 0xb08) = 0x7ff0000000000000;
      }
      uVar39 = 7;
      for (uVar41 = 0; uVar41 != uVar46; uVar41 = uVar41 + 1) {
        uVar15 = (uVar41 * num_commands) / uVar46;
        if (uVar41 != 0) {
          iVar31 = (int)uVar39;
          uVar39 = (ulong)(uint)(iVar31 * 0x41a7);
          if (iVar31 == 0) {
            uVar39 = 1;
          }
          uVar15 = uVar15 + uVar39 % (num_commands / uVar46);
        }
        if (num_commands <= uVar15 + 0x28) {
          uVar15 = num_commands - 0x29;
        }
        plVar2 = (long *)((long)pvVar17 + uVar41 * 0xb10 + 0xb00);
        *plVar2 = *plVar2 + 0x28;
        for (lVar43 = 0; lVar43 != 0x28; lVar43 = lVar43 + 1) {
          piVar1 = (int *)((long)pvVar17 +
                          (ulong)*(ushort *)((long)pvVar11 + lVar43 * 2 + uVar15 * 2) * 4 +
                          uVar41 * 0xb10);
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar41 = (num_commands * 2) / 0x28 + uVar46 + 99;
      uVar39 = 7;
      for (uVar15 = 0; uVar15 < uVar41 - uVar41 % uVar46; uVar15 = uVar15 + 1) {
        memset(local_b40,0,0xb08);
        iVar31 = (int)uVar39;
        uVar39 = (ulong)(uint)(iVar31 * 0x41a7);
        if (iVar31 == 0) {
          uVar39 = 1;
        }
        puVar16 = (ushort *)((long)pvVar11 + (uVar39 % (num_commands - 0x27)) * 2);
        for (lVar43 = -0x28; lVar43 != 0; lVar43 = lVar43 + 1) {
          uVar6 = *puVar16;
          puVar16 = puVar16 + 1;
          *(int *)(local_b40 + (ulong)uVar6 * 4) = *(int *)(local_b40 + (ulong)uVar6 * 4) + 1;
        }
        lVar43 = (uVar15 % uVar46) * 0xb10;
        plVar2 = (long *)((long)pvVar17 + lVar43 + 0xb00);
        *plVar2 = *plVar2 + 0x28;
        for (lVar28 = 0; lVar28 != 0x2c0; lVar28 = lVar28 + 1) {
          piVar1 = (int *)((long)pvVar17 + lVar28 * 4 + lVar43);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar28 * 4);
        }
      }
      pvVar19 = BrotliAllocate(m,num_commands);
      iVar31 = (int)uVar46;
      pdVar18 = (double *)BrotliAllocate(m,uVar46 * 0x1600);
      pvVar20 = BrotliAllocate(m,(ulong)(uint)(iVar31 * 8));
      sVar7 = (iVar31 + 7U >> 3) * num_commands;
      if (sVar7 == 0) {
        local_fe0 = (uint32_t *)0x0;
      }
      else {
        local_fe0 = (uint32_t *)BrotliAllocate(m,sVar7);
      }
      pvVar22 = BrotliAllocate(m,(ulong)(uint)(iVar31 * 2));
      lVar43 = 3;
      if (10 < params->quality) {
        lVar43 = 10;
      }
      local_fd8 = 0;
      for (lVar28 = 0; lVar28 != lVar43; lVar28 = lVar28 + 1) {
        if (uVar46 < 2) {
          for (sVar7 = 0; num_commands != sVar7; sVar7 = sVar7 + 1) {
            *(undefined1 *)((long)pvVar19 + sVar7) = 0;
          }
          local_fd8 = 1;
        }
        else {
          uVar39 = uVar46 + 7 >> 3;
          memset(pdVar18,0,uVar46 * 0x1600);
          puVar33 = (uint *)((long)pvVar17 + 0xb00);
          for (uVar41 = 0; uVar46 != uVar41; uVar41 = uVar41 + 1) {
            uVar15 = (ulong)*puVar33;
            if (uVar15 < 0x100) {
              dVar48 = (double)kLog2Table[uVar15];
            }
            else {
              dVar48 = log2((double)uVar15);
            }
            pdVar18[uVar41] = dVar48;
            puVar33 = puVar33 + 0x2c4;
          }
          lVar42 = uVar46 * 0x15f8;
          lVar44 = 0x2c0;
          lVar21 = (long)pvVar17 + 0xafc;
          while (bVar47 = lVar44 != 0, lVar44 = lVar44 + -1, bVar47) {
            pdVar35 = pdVar18;
            for (lVar36 = 0; uVar46 * 0x162 - lVar36 != 0; lVar36 = lVar36 + 0x162) {
              dVar48 = *pdVar35;
              uVar4 = *(uint *)(lVar21 + lVar36 * 8);
              uVar41 = (ulong)uVar4;
              dVar49 = -2.0;
              if (uVar41 != 0) {
                if (uVar4 < 0x100) {
                  dVar49 = (double)kLog2Table[uVar41];
                }
                else {
                  dVar49 = log2((double)uVar41);
                }
              }
              *(double *)((long)pdVar35 + lVar42) = dVar48 - dVar49;
              pdVar35 = pdVar35 + 1;
            }
            lVar42 = lVar42 + uVar46 * -8;
            lVar21 = lVar21 + -4;
          }
          memset(pvVar20,0,uVar46 * 8);
          memset(local_fe0,0,uVar39 * num_commands);
          for (uVar41 = 0; uVar41 != num_commands; uVar41 = uVar41 + 1) {
            uVar6 = *(ushort *)((long)pvVar11 + uVar41 * 2);
            dVar48 = 1e+99;
            for (uVar15 = 0; uVar46 != uVar15; uVar15 = uVar15 + 1) {
              dVar49 = pdVar18[uVar6 * uVar46 + uVar15] + *(double *)((long)pvVar20 + uVar15 * 8);
              *(double *)((long)pvVar20 + uVar15 * 8) = dVar49;
              if (dVar49 < dVar48) {
                *(char *)((long)pvVar19 + uVar41) = (char)uVar15;
                dVar48 = dVar49;
              }
            }
            dVar49 = 13.5;
            if (uVar41 < 2000) {
              dVar49 = (((double)(long)uVar41 * 0.07) / 2000.0 + 0.77) * 13.5;
            }
            for (uVar15 = 0; uVar46 != uVar15; uVar15 = uVar15 + 1) {
              dVar50 = *(double *)((long)pvVar20 + uVar15 * 8) - dVar48;
              *(double *)((long)pvVar20 + uVar15 * 8) = dVar50;
              if (dVar49 <= dVar50) {
                *(double *)((long)pvVar20 + uVar15 * 8) = dVar49;
                if (uVar39 <= uVar15 >> 3) {
                  pcVar30 = 
                  "size_t FindBlocksCommand(const uint16_t *, const size_t, const double, const size_t, const HistogramCommand *, double *, double *, uint8_t *, uint8_t *)"
                  ;
                  goto LAB_00114286;
                }
                pbVar32 = (byte *)((long)local_fe0 + (uVar15 >> 3) + uVar41 * uVar39);
                *pbVar32 = *pbVar32 | '\x01' << ((byte)uVar15 & 7);
              }
            }
          }
          bVar5 = *(byte *)((long)pvVar19 + (num_commands - 1));
          pvVar13 = (void *)((num_commands - 2) * uVar39 + (long)local_fe0);
          local_fd8 = 1;
          for (sVar7 = num_commands; sVar7 != 1; sVar7 = sVar7 - 1) {
            if (uVar39 <= bVar5 >> 3) {
              pcVar30 = 
              "size_t FindBlocksCommand(const uint16_t *, const size_t, const double, const size_t, const HistogramCommand *, double *, double *, uint8_t *, uint8_t *)"
              ;
              goto LAB_0011436d;
            }
            if ((*(byte *)((long)pvVar13 + (ulong)(bVar5 >> 3)) >> (bVar5 & 7) & 1) != 0) {
              bVar37 = *(byte *)((long)pvVar19 + (sVar7 - 2));
              local_fd8 = local_fd8 + (bVar5 != bVar37);
              bVar5 = bVar37;
            }
            *(byte *)((long)pvVar19 + (sVar7 - 2)) = bVar5;
            pvVar13 = (void *)((long)pvVar13 - uVar39);
          }
        }
        for (uVar39 = 0; uVar46 != uVar39; uVar39 = uVar39 + 1) {
          *(undefined2 *)((long)pvVar22 + uVar39 * 2) = 0x100;
        }
        uVar6 = 0;
        for (sVar7 = 0; num_commands != sVar7; sVar7 = sVar7 + 1) {
          uVar39 = (ulong)*(byte *)((long)pvVar19 + sVar7);
          if (uVar46 <= uVar39) {
            pcVar30 = 
            "size_t RemapBlockIdsCommand(uint8_t *, const size_t, uint16_t *, const size_t)";
            goto LAB_00114301;
          }
          if (*(short *)((long)pvVar22 + uVar39 * 2) == 0x100) {
            *(ushort *)((long)pvVar22 + uVar39 * 2) = uVar6;
            uVar6 = uVar6 + 1;
          }
        }
        sVar7 = 0;
        while (num_commands != sVar7) {
          uVar3 = *(ushort *)((long)pvVar22 + (ulong)*(byte *)((long)pvVar19 + sVar7) * 2);
          *(char *)((long)pvVar19 + sVar7) = (char)uVar3;
          sVar7 = sVar7 + 1;
          if ((ushort)uVar46 <= (uVar3 & 0xff)) {
            pcVar30 = 
            "size_t RemapBlockIdsCommand(uint8_t *, const size_t, uint16_t *, const size_t)";
            goto LAB_00114320;
          }
        }
        uVar39 = (ulong)uVar6;
        if (uVar46 < uVar39) {
          pcVar30 = "size_t RemapBlockIdsCommand(uint8_t *, const size_t, uint16_t *, const size_t)"
          ;
          goto LAB_0011445d;
        }
        for (lVar21 = 0; uVar39 * 0xb10 - lVar21 != 0; lVar21 = lVar21 + 0xb10) {
          memset((void *)((long)pvVar17 + lVar21),0,0xb08);
          *(undefined8 *)((long)pvVar17 + lVar21 + 0xb08) = 0x7ff0000000000000;
        }
        for (sVar7 = 0; num_commands != sVar7; sVar7 = sVar7 + 1) {
          lVar21 = (ulong)*(byte *)((long)pvVar19 + sVar7) * 0xb10;
          piVar1 = (int *)((long)pvVar17 +
                          (ulong)*(ushort *)((long)pvVar11 + sVar7 * 2) * 4 + lVar21);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar17 + lVar21 + 0xb00);
          *plVar2 = *plVar2 + 1;
        }
        uVar46 = uVar39;
      }
      BrotliFree(m,pdVar18);
      BrotliFree(m,pvVar20);
      BrotliFree(m,local_fe0);
      BrotliFree(m,pvVar22);
      BrotliFree(m,pvVar17);
      if (local_fd8 == 0) {
        local_fd0 = (uint32_t *)0x0;
        pvVar17 = (void *)0x0;
      }
      else {
        local_fd0 = (uint32_t *)BrotliAllocate(m,local_fd8 * 4);
        pvVar17 = BrotliAllocate(m,local_fd8 * 4);
      }
      uVar39 = local_fd8 * 0x10 + 0x3f0;
      uVar46 = uVar39 >> 6;
      if (uVar39 < 0x40) {
        local_1000 = (HistogramCommand *)0x0;
        local_fa8 = (uint32_t *)0x0;
      }
      else {
        local_1000 = (HistogramCommand *)BrotliAllocate(m,uVar46 * 0xb10);
        local_fa8 = (uint32_t *)BrotliAllocate(m,uVar46 * 4);
      }
      if (local_fd8 == 0) {
        local_ff0 = (HistogramCommand *)0x0;
      }
      else {
        uVar39 = 0x40;
        if (local_fd8 < 0x40) {
          uVar39 = local_fd8;
        }
        local_ff0 = (HistogramCommand *)BrotliAllocate(m,uVar39 * 0xb10);
      }
      local_f78 = (HistogramPair *)BrotliAllocate(m,0xc018);
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar17,0,local_fd8 * 4);
      uVar39 = 0;
      sVar7 = 0;
      while (sVar40 = sVar7 + 1, sVar40 - num_commands != 1) {
        if (local_fd8 <= uVar39) {
          pcVar30 = 
          "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
          goto LAB_0011441f;
        }
        piVar1 = (int *)((long)pvVar17 + uVar39 * 4);
        *piVar1 = *piVar1 + 1;
        if ((sVar40 == num_commands) ||
           (pcVar30 = (char *)((long)pvVar19 + sVar7), sVar7 = sVar40,
           *pcVar30 != *(char *)((long)pvVar19 + sVar40))) {
          uVar39 = uVar39 + 1;
          sVar7 = sVar40;
        }
      }
      if (uVar39 != local_fd8) {
        pcVar30 = 
        "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
        ;
        goto LAB_001144aa;
      }
      local_ff8 = (HistogramDistance *)0x0;
      local_fc0 = local_fd0;
      uVar23 = 0;
      uVar39 = local_fd8;
      uVar41 = uVar46;
      uVar15 = 0;
      while( true ) {
        uVar29 = 0x40;
        if (uVar39 < 0x40) {
          uVar29 = uVar39;
        }
        uVar24 = local_fd8 - uVar23;
        if (local_fd8 < uVar23 || uVar24 == 0) {
          BrotliFree(m,local_ff0);
          uVar46 = (uVar15 >> 1) * uVar15;
          if (uVar15 << 6 < uVar46) {
            uVar46 = uVar15 << 6;
          }
          if (0x800 < uVar46) {
            BrotliFree(m,local_f78);
            local_f78 = (HistogramPair *)BrotliAllocate(m,uVar46 * 0x18 + 0x18);
          }
          if (uVar15 == 0) {
            puVar9 = (uint32_t *)0x0;
          }
          else {
            puVar9 = (uint32_t *)BrotliAllocate(m,uVar15 * 4);
          }
          for (uVar39 = 0; uVar15 != uVar39; uVar39 = uVar39 + 1) {
            puVar9[uVar39] = (uint32_t)uVar39;
          }
          sVar7 = BrotliHistogramCombineCommand
                            (local_1000,local_fa8,local_fd0,puVar9,local_f78,uVar15,local_fd8,0x100,
                             uVar46);
          BrotliFree(m,local_f78);
          BrotliFree(m,local_fa8);
          if (uVar15 == 0) {
            pvVar20 = (void *)0x0;
          }
          else {
            pvVar20 = BrotliAllocate(m,uVar15 * 4);
          }
          for (uVar46 = 0; uVar15 != uVar46; uVar46 = uVar46 + 1) {
            *(undefined4 *)((long)pvVar20 + uVar46 * 4) = 0xffffffff;
          }
          local_ff8 = (HistogramDistance *)0x0;
          iVar31 = 0;
          for (uVar46 = 0; uVar46 != local_fd8; uVar46 = uVar46 + 1) {
            memset(local_b40,0,0xb08);
            local_38 = INFINITY;
            uVar39 = 0;
            while (uVar39 < *(uint *)((long)pvVar17 + uVar46 * 4)) {
              *(int *)(local_b40 +
                      (ulong)*(ushort *)((long)pvVar11 + uVar39 * 2 + (long)local_ff8 * 2) * 4) =
                   *(int *)(local_b40 +
                           (ulong)*(ushort *)((long)pvVar11 + uVar39 * 2 + (long)local_ff8 * 2) * 4)
                   + 1;
              uVar39 = uVar39 + 1;
              local_40 = uVar39;
            }
            lVar43 = uVar46 - 1;
            if (uVar46 == 0) {
              lVar43 = 0;
            }
            uVar41 = (ulong)local_fd0[lVar43];
            local_ff0 = (HistogramCommand *)
                        BrotliHistogramBitCostDistanceCommand
                                  ((HistogramCommand *)local_b40,local_1000 + uVar41);
            local_ff8 = (HistogramDistance *)((long)local_ff8 + uVar39);
            for (sVar40 = 0; sVar7 != sVar40; sVar40 = sVar40 + 1) {
              dVar48 = BrotliHistogramBitCostDistanceCommand
                                 ((HistogramCommand *)local_b40,local_1000 + puVar9[sVar40]);
              if (dVar48 < (double)local_ff0) {
                uVar41 = (ulong)puVar9[sVar40];
                local_ff0 = (HistogramCommand *)dVar48;
              }
            }
            local_fd0[uVar46] = (uint32_t)uVar41;
            if (*(int *)((long)pvVar20 + uVar41 * 4) == -1) {
              *(int *)((long)pvVar20 + uVar41 * 4) = iVar31;
              iVar31 = iVar31 + 1;
            }
          }
          BrotliFree(m,puVar9);
          BrotliFree(m,local_1000);
          uVar46 = insert_and_copy_split->types_alloc_size;
          if (uVar46 < local_fd8) {
            if (uVar46 == 0) {
              uVar46 = local_fd8;
            }
            do {
              uVar39 = uVar46;
              uVar46 = uVar39 * 2;
            } while (uVar39 < local_fd8);
            puVar8 = (uint8_t *)BrotliAllocate(m,uVar39);
            if (insert_and_copy_split->types_alloc_size != 0) {
              memcpy(puVar8,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
            }
            BrotliFree(m,insert_and_copy_split->types);
            insert_and_copy_split->types = puVar8;
            insert_and_copy_split->types_alloc_size = uVar39;
          }
          uVar46 = insert_and_copy_split->lengths_alloc_size;
          if (uVar46 < local_fd8) {
            if (uVar46 == 0) {
              uVar46 = local_fd8;
            }
            do {
              uVar39 = uVar46;
              uVar46 = uVar39 * 2;
            } while (uVar39 < local_fd8);
            puVar9 = (uint32_t *)BrotliAllocate(m,uVar39 * 4);
            if (insert_and_copy_split->lengths_alloc_size != 0) {
              memcpy(puVar9,insert_and_copy_split->lengths,
                     insert_and_copy_split->lengths_alloc_size << 2);
            }
            BrotliFree(m,insert_and_copy_split->lengths);
            insert_and_copy_split->lengths = puVar9;
            insert_and_copy_split->lengths_alloc_size = uVar39;
          }
          uVar46 = 0;
          uVar39 = 0;
          sVar7 = 0;
          do {
            uVar38 = 0;
            uVar41 = uVar39;
            do {
              uVar39 = uVar41 + 1;
              uVar15 = uVar46 & 0xff;
              if (uVar39 - local_fd8 == 1) {
                insert_and_copy_split->num_blocks = sVar7;
                insert_and_copy_split->num_types = uVar15 + 1;
                BrotliFree(m,pvVar20);
                BrotliFree(m,pvVar17);
                BrotliFree(m,local_fd0);
                BrotliFree(m,pvVar19);
                goto LAB_0011303f;
              }
              uVar38 = uVar38 + *(int *)((long)pvVar17 + uVar39 * 4 + -4);
              puVar33 = local_fd0 + uVar41;
            } while ((uVar39 != local_fd8) && (uVar41 = uVar39, *puVar33 == local_fd0[uVar39]));
            uVar4 = *(uint *)((long)pvVar20 + (ulong)*puVar33 * 4);
            bVar5 = (byte)uVar4;
            insert_and_copy_split->types[sVar7] = bVar5;
            insert_and_copy_split->lengths[sVar7] = uVar38;
            bVar37 = (byte)uVar46;
            uVar46 = (ulong)uVar4;
            if (bVar5 < bVar37) {
              uVar46 = uVar15;
            }
            sVar7 = sVar7 + 1;
          } while( true );
        }
        for (uVar34 = 0; uVar34 != uVar29; uVar34 = uVar34 + 1) {
          pHVar14 = local_ff0 + uVar34;
          memset(pHVar14,0,0xb08);
          local_ff0[uVar34].bit_cost_ = INFINITY;
          uVar45 = 0;
          while (uVar45 < *(uint *)((long)pvVar17 + (uVar23 + uVar34) * 4)) {
            pHVar14->data_[*(ushort *)((long)pvVar11 + uVar45 * 2 + (long)local_ff8 * 2)] =
                 pHVar14->data_[*(ushort *)((long)pvVar11 + uVar45 * 2 + (long)local_ff8 * 2)] + 1;
            uVar45 = uVar45 + 1;
            pHVar14->total_count_ = uVar45;
          }
          dVar48 = BrotliPopulationCostCommand(pHVar14);
          pHVar14->bit_cost_ = dVar48;
          new_clusters[uVar34] = (uint32_t)uVar34;
          symbols[uVar34] = (uint32_t)uVar34;
          sizes[uVar34] = 1;
          local_ff8 = (HistogramDistance *)((long)local_ff8 + uVar45);
        }
        if (0x3f < uVar24) {
          uVar24 = 0x40;
        }
        sVar7 = BrotliHistogramCombineCommand
                          (local_ff0,sizes,symbols,new_clusters,local_f78,uVar24,uVar24,0x40,0x800);
        uVar24 = sVar7 + uVar15;
        if (uVar41 < uVar24) {
          uVar34 = uVar41;
          if (uVar41 == 0) {
            uVar34 = uVar24;
          }
          do {
            uVar45 = uVar34;
            uVar34 = uVar45 * 2;
          } while (uVar45 < uVar24);
          pHVar14 = (HistogramCommand *)BrotliAllocate(m,uVar45 * 0xb10);
          if (uVar41 != 0) {
            memcpy(pHVar14,local_1000,uVar41 * 0xb10);
          }
          BrotliFree(m,local_1000);
          local_1000 = pHVar14;
          uVar41 = uVar45;
        }
        if (uVar46 < uVar24) {
          uVar34 = uVar46;
          if (uVar46 == 0) {
            uVar34 = uVar24;
          }
          do {
            uVar45 = uVar34;
            uVar34 = uVar45 * 2;
          } while (uVar45 < uVar24);
          puVar9 = (uint32_t *)BrotliAllocate(m,uVar45 * 4);
          if (uVar46 != 0) {
            memcpy(puVar9,local_fa8,uVar46 << 2);
          }
          BrotliFree(m,local_fa8);
          local_fa8 = puVar9;
          uVar46 = uVar45;
        }
        pHVar14 = local_1000 + uVar15;
        for (sVar40 = 0; sVar7 != sVar40; sVar40 = sVar40 + 1) {
          uVar4 = new_clusters[sVar40];
          memcpy(pHVar14,local_ff0 + uVar4,0xb10);
          local_fa8[uVar15 + sVar40] = sizes[uVar4];
          remap[new_clusters[sVar40]] = (uint32_t)sVar40;
          pHVar14 = pHVar14 + 1;
        }
        for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
          local_fc0[uVar34] = remap[symbols[uVar34]] + (int)uVar15;
        }
        if (sVar7 != sVar40) break;
        uVar23 = uVar23 + 0x40;
        uVar39 = uVar39 - 0x40;
        local_fc0 = local_fc0 + 0x40;
        uVar15 = uVar24;
      }
      pcVar30 = 
      "void ClusterBlocksCommand(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
      ;
      goto LAB_0011443e;
    }
    sVar7 = insert_and_copy_split->num_blocks;
    uVar39 = insert_and_copy_split->types_alloc_size;
    uVar46 = sVar7 + 1;
    if (uVar39 < uVar46) {
      if (uVar39 == 0) {
        uVar39 = uVar46;
      }
      do {
        uVar41 = uVar39;
        uVar39 = uVar41 * 2;
      } while (uVar41 < uVar46);
      puVar8 = (uint8_t *)BrotliAllocate(m,uVar41);
      if (insert_and_copy_split->types_alloc_size != 0) {
        memcpy(puVar8,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
      }
      BrotliFree(m,insert_and_copy_split->types);
      insert_and_copy_split->types = puVar8;
      insert_and_copy_split->types_alloc_size = uVar41;
      sVar7 = insert_and_copy_split->num_blocks;
      uVar46 = sVar7 + 1;
    }
    uVar39 = insert_and_copy_split->lengths_alloc_size;
    if (uVar39 < uVar46) {
      if (uVar39 == 0) {
        uVar39 = uVar46;
      }
      do {
        uVar41 = uVar39;
        uVar39 = uVar41 * 2;
      } while (uVar41 < uVar46);
      puVar9 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
      if (insert_and_copy_split->lengths_alloc_size != 0) {
        memcpy(puVar9,insert_and_copy_split->lengths,insert_and_copy_split->lengths_alloc_size << 2)
        ;
      }
      BrotliFree(m,insert_and_copy_split->lengths);
      insert_and_copy_split->lengths = puVar9;
      insert_and_copy_split->lengths_alloc_size = uVar41;
      sVar7 = insert_and_copy_split->num_blocks;
    }
    insert_and_copy_split->num_types = 1;
    insert_and_copy_split->types[sVar7] = '\0';
    sVar7 = insert_and_copy_split->num_blocks;
    insert_and_copy_split->lengths[sVar7] = (uint32_t)num_commands;
    insert_and_copy_split->num_blocks = sVar7 + 1;
  }
LAB_0011303f:
  BrotliFree(m,pvVar11);
  if (num_commands == 0) {
    local_fc0 = (uint32_t *)0x0;
  }
  else {
    local_fc0 = (uint32_t *)BrotliAllocate(m,num_commands * 2);
  }
  puVar12 = &cmds->dist_prefix_;
  uVar46 = 0;
  while (bVar47 = num_commands != 0, num_commands = num_commands - 1, bVar47) {
    if (((*(uint *)(puVar12 + -5) & 0xffffff) != 0) && (0x7f < puVar12[-1])) {
      *(uint16_t *)((long)local_fc0 + uVar46 * 2) = *puVar12;
      uVar46 = uVar46 + 1;
    }
    puVar12 = puVar12 + 8;
  }
  local_fb8 = (ulong)(ushort)((ushort)uVar46 / 0x220 + 1);
  if (0x6a3f < uVar46) {
    local_fb8 = 0x32;
  }
  if (uVar46 == 0) {
    dist_split->num_types = 1;
  }
  else {
    if (0x7f < uVar46) {
      pvVar11 = BrotliAllocate(m,local_fb8 * 0x830);
      for (lVar43 = 0; local_fb8 * 0x830 - lVar43 != 0; lVar43 = lVar43 + 0x830) {
        memset((void *)((long)pvVar11 + lVar43),0,0x828);
        *(undefined8 *)((long)pvVar11 + lVar43 + 0x828) = 0x7ff0000000000000;
      }
      uVar39 = 7;
      for (uVar41 = 0; uVar41 != local_fb8; uVar41 = uVar41 + 1) {
        uVar15 = (uVar41 * uVar46) / local_fb8;
        if (uVar41 != 0) {
          iVar31 = (int)uVar39;
          uVar39 = (ulong)(uint)(iVar31 * 0x41a7);
          if (iVar31 == 0) {
            uVar39 = 1;
          }
          uVar15 = uVar15 + uVar39 % (uVar46 / local_fb8);
        }
        if (uVar46 <= uVar15 + 0x28) {
          uVar15 = uVar46 - 0x29;
        }
        plVar2 = (long *)((long)pvVar11 + uVar41 * 0x830 + 0x820);
        *plVar2 = *plVar2 + 0x28;
        for (lVar43 = 0; lVar43 != 0x28; lVar43 = lVar43 + 1) {
          piVar1 = (int *)((long)pvVar11 +
                          (ulong)*(ushort *)((long)local_fc0 + lVar43 * 2 + uVar15 * 2) * 4 +
                          uVar41 * 0x830);
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar15 = local_fb8 + (uVar46 * 2) / 0x28 + 99;
      uVar39 = 7;
      for (uVar41 = 0; uVar41 < uVar15 - uVar15 % local_fb8; uVar41 = uVar41 + 1) {
        memset(local_b40,0,0x828);
        iVar31 = (int)uVar39;
        uVar39 = (ulong)(uint)(iVar31 * 0x41a7);
        if (iVar31 == 0) {
          uVar39 = 1;
        }
        puVar16 = (ushort *)((long)local_fc0 + (uVar39 % (uVar46 - 0x27)) * 2);
        for (lVar43 = -0x28; lVar43 != 0; lVar43 = lVar43 + 1) {
          uVar6 = *puVar16;
          puVar16 = puVar16 + 1;
          *(int *)(local_b40 + (ulong)uVar6 * 4) = *(int *)(local_b40 + (ulong)uVar6 * 4) + 1;
        }
        lVar43 = (uVar41 % local_fb8) * 0x830;
        plVar2 = (long *)((long)pvVar11 + lVar43 + 0x820);
        *plVar2 = *plVar2 + 0x28;
        for (lVar28 = 0; lVar28 != 0x208; lVar28 = lVar28 + 1) {
          piVar1 = (int *)((long)pvVar11 + lVar28 * 4 + lVar43);
          *piVar1 = *piVar1 + *(int *)(local_b40 + lVar28 * 4);
        }
      }
      pvVar17 = BrotliAllocate(m,uVar46);
      iVar31 = (int)local_fb8;
      pdVar18 = (double *)BrotliAllocate(m,local_fb8 * 0x1040);
      pvVar19 = BrotliAllocate(m,(ulong)(uint)(iVar31 * 8));
      sVar7 = (iVar31 + 7U >> 3) * uVar46;
      if (sVar7 == 0) {
        local_fb0 = (uint32_t *)0x0;
      }
      else {
        local_fb0 = (uint32_t *)BrotliAllocate(m,sVar7);
      }
      pvVar20 = BrotliAllocate(m,(ulong)(uint)(iVar31 * 2));
      if (10 < params->quality) {
        local_f50 = 10;
      }
      uVar39 = 0;
      for (lVar43 = 0; lVar43 != local_f50; lVar43 = lVar43 + 1) {
        if (local_fb8 < 2) {
          for (uVar39 = 0; uVar46 != uVar39; uVar39 = uVar39 + 1) {
            *(undefined1 *)((long)pvVar17 + uVar39) = 0;
          }
          uVar39 = 1;
        }
        else {
          uVar41 = local_fb8 + 7 >> 3;
          memset(pdVar18,0,local_fb8 * 0x1040);
          puVar33 = (uint *)((long)pvVar11 + 0x820);
          for (uVar39 = 0; local_fb8 != uVar39; uVar39 = uVar39 + 1) {
            uVar15 = (ulong)*puVar33;
            if (uVar15 < 0x100) {
              dVar48 = (double)kLog2Table[uVar15];
            }
            else {
              dVar48 = log2((double)uVar15);
            }
            pdVar18[uVar39] = dVar48;
            puVar33 = puVar33 + 0x20c;
          }
          lVar44 = local_fb8 * 0x1038;
          lVar21 = 0x208;
          lVar28 = (long)pvVar11 + 0x81c;
          while (bVar47 = lVar21 != 0, lVar21 = lVar21 + -1, bVar47) {
            pdVar35 = pdVar18;
            for (lVar42 = 0; local_fb8 * 0x106 - lVar42 != 0; lVar42 = lVar42 + 0x106) {
              dVar48 = *pdVar35;
              uVar4 = *(uint *)(lVar28 + lVar42 * 8);
              uVar39 = (ulong)uVar4;
              dVar49 = -2.0;
              if (uVar39 != 0) {
                if (uVar4 < 0x100) {
                  dVar49 = (double)kLog2Table[uVar39];
                }
                else {
                  dVar49 = log2((double)uVar39);
                }
              }
              *(double *)((long)pdVar35 + lVar44) = dVar48 - dVar49;
              pdVar35 = pdVar35 + 1;
            }
            lVar44 = lVar44 + local_fb8 * -8;
            lVar28 = lVar28 + -4;
          }
          memset(pvVar19,0,local_fb8 * 8);
          memset(local_fb0,0,uVar41 * uVar46);
          for (uVar39 = 0; uVar39 != uVar46; uVar39 = uVar39 + 1) {
            uVar6 = *(ushort *)((long)local_fc0 + uVar39 * 2);
            dVar48 = 1e+99;
            for (uVar15 = 0; local_fb8 != uVar15; uVar15 = uVar15 + 1) {
              dVar49 = pdVar18[uVar6 * local_fb8 + uVar15] + *(double *)((long)pvVar19 + uVar15 * 8)
              ;
              *(double *)((long)pvVar19 + uVar15 * 8) = dVar49;
              if (dVar49 < dVar48) {
                *(char *)((long)pvVar17 + uVar39) = (char)uVar15;
                dVar48 = dVar49;
              }
            }
            dVar49 = 14.6;
            if (uVar39 < 2000) {
              dVar49 = (((double)(long)uVar39 * 0.07) / 2000.0 + 0.77) * 14.6;
            }
            for (uVar15 = 0; local_fb8 != uVar15; uVar15 = uVar15 + 1) {
              dVar50 = *(double *)((long)pvVar19 + uVar15 * 8) - dVar48;
              *(double *)((long)pvVar19 + uVar15 * 8) = dVar50;
              if (dVar49 <= dVar50) {
                *(double *)((long)pvVar19 + uVar15 * 8) = dVar49;
                if (uVar41 <= uVar15 >> 3) {
                  pcVar30 = 
                  "size_t FindBlocksDistance(const uint16_t *, const size_t, const double, const size_t, const HistogramDistance *, double *, double *, uint8_t *, uint8_t *)"
                  ;
LAB_00114286:
                  __assert_fail("(k >> 3) < bitmaplen",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                                ,0x82,pcVar30);
                }
                pbVar32 = (byte *)((long)local_fb0 + (uVar15 >> 3) + uVar39 * uVar41);
                *pbVar32 = *pbVar32 | '\x01' << ((byte)uVar15 & 7);
              }
            }
          }
          bVar5 = *(byte *)((long)pvVar17 + (uVar46 - 1));
          pvVar22 = (void *)((uVar46 - 2) * uVar41 + (long)local_fb0);
          uVar39 = 1;
          for (uVar15 = uVar46; uVar15 != 1; uVar15 = uVar15 - 1) {
            if (uVar41 <= bVar5 >> 3) {
              pcVar30 = 
              "size_t FindBlocksDistance(const uint16_t *, const size_t, const double, const size_t, const HistogramDistance *, double *, double *, uint8_t *, uint8_t *)"
              ;
LAB_0011436d:
              __assert_fail("((size_t)cur_id >> 3) < bitmaplen",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                            ,0x8d,pcVar30);
            }
            if ((*(byte *)((long)pvVar22 + (ulong)(bVar5 >> 3)) >> (bVar5 & 7) & 1) != 0) {
              bVar37 = *(byte *)((long)pvVar17 + (uVar15 - 2));
              uVar39 = uVar39 + (bVar5 != bVar37);
              bVar5 = bVar37;
            }
            *(byte *)((long)pvVar17 + (uVar15 - 2)) = bVar5;
            pvVar22 = (void *)((long)pvVar22 - uVar41);
          }
        }
        for (uVar41 = 0; local_fb8 != uVar41; uVar41 = uVar41 + 1) {
          *(undefined2 *)((long)pvVar20 + uVar41 * 2) = 0x100;
        }
        uVar6 = 0;
        for (uVar41 = 0; uVar46 != uVar41; uVar41 = uVar41 + 1) {
          uVar15 = (ulong)*(byte *)((long)pvVar17 + uVar41);
          if (local_fb8 <= uVar15) {
            pcVar30 = 
            "size_t RemapBlockIdsDistance(uint8_t *, const size_t, uint16_t *, const size_t)";
LAB_00114301:
            __assert_fail("block_ids[i] < num_histograms",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                          ,0xa5,pcVar30);
          }
          if (*(short *)((long)pvVar20 + uVar15 * 2) == 0x100) {
            *(ushort *)((long)pvVar20 + uVar15 * 2) = uVar6;
            uVar6 = uVar6 + 1;
          }
        }
        uVar41 = 0;
        while (uVar46 != uVar41) {
          uVar3 = *(ushort *)((long)pvVar20 + (ulong)*(byte *)((long)pvVar17 + uVar41) * 2);
          *(char *)((long)pvVar17 + uVar41) = (char)uVar3;
          uVar41 = uVar41 + 1;
          if ((ushort)local_fb8 <= (uVar3 & 0xff)) {
            pcVar30 = 
            "size_t RemapBlockIdsDistance(uint8_t *, const size_t, uint16_t *, const size_t)";
LAB_00114320:
            __assert_fail("block_ids[i] < num_histograms",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                          ,0xac,pcVar30);
          }
        }
        uVar41 = (ulong)uVar6;
        if (local_fb8 < uVar41) {
          pcVar30 = 
          "size_t RemapBlockIdsDistance(uint8_t *, const size_t, uint16_t *, const size_t)";
LAB_0011445d:
          __assert_fail("next_id <= num_histograms",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                        ,0xae,pcVar30);
        }
        for (lVar28 = 0; uVar41 * 0x830 - lVar28 != 0; lVar28 = lVar28 + 0x830) {
          memset((void *)((long)pvVar11 + lVar28),0,0x828);
          *(undefined8 *)((long)pvVar11 + lVar28 + 0x828) = 0x7ff0000000000000;
        }
        for (uVar15 = 0; uVar46 != uVar15; uVar15 = uVar15 + 1) {
          lVar28 = (ulong)*(byte *)((long)pvVar17 + uVar15) * 0x830;
          piVar1 = (int *)((long)pvVar11 +
                          (ulong)*(ushort *)((long)local_fc0 + uVar15 * 2) * 4 + lVar28);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar11 + lVar28 + 0x820);
          *plVar2 = *plVar2 + 1;
        }
        local_fb8 = uVar41;
      }
      BrotliFree(m,pdVar18);
      BrotliFree(m,pvVar19);
      BrotliFree(m,local_fb0);
      BrotliFree(m,pvVar20);
      BrotliFree(m,pvVar11);
      if (uVar39 == 0) {
        local_fe0 = (uint32_t *)0x0;
        pvVar11 = (void *)0x0;
      }
      else {
        local_fe0 = (uint32_t *)BrotliAllocate(m,uVar39 * 4);
        pvVar11 = BrotliAllocate(m,uVar39 * 4);
      }
      uVar15 = uVar39 * 0x10 + 0x3f0;
      uVar41 = uVar15 >> 6;
      if (uVar15 < 0x40) {
        out = (HistogramDistance *)0x0;
        local_fb0 = (uint32_t *)0x0;
      }
      else {
        out = (HistogramDistance *)BrotliAllocate(m,uVar41 * 0x830);
        local_fb0 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
      }
      if (uVar39 == 0) {
        local_ff8 = (HistogramDistance *)0x0;
      }
      else {
        uVar15 = 0x40;
        if (uVar39 < 0x40) {
          uVar15 = uVar39;
        }
        local_ff8 = (HistogramDistance *)BrotliAllocate(m,uVar15 * 0x830);
      }
      local_f68 = (HistogramPair *)BrotliAllocate(m,0xc018);
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar11,0,uVar39 * 4);
      uVar23 = 0;
      uVar15 = 0;
      while (uVar29 = uVar15 + 1, uVar29 - uVar46 != 1) {
        if (uVar39 <= uVar23) {
          pcVar30 = 
          "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
          ;
LAB_0011441f:
          __assert_fail("block_idx < num_blocks",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                        ,0xe7,pcVar30);
        }
        piVar1 = (int *)((long)pvVar11 + uVar23 * 4);
        *piVar1 = *piVar1 + 1;
        if ((uVar29 == uVar46) ||
           (pcVar30 = (char *)((long)pvVar17 + uVar15), uVar15 = uVar29,
           *pcVar30 != *(char *)((long)pvVar17 + uVar29))) {
          uVar23 = uVar23 + 1;
          uVar15 = uVar29;
        }
      }
      if (uVar23 != uVar39) {
        pcVar30 = 
        "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
        ;
LAB_001144aa:
        __assert_fail("block_idx == num_blocks",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                      ,0xed,pcVar30);
      }
      local_1000 = (HistogramCommand *)0x0;
      local_f90 = local_fe0;
      local_fb8 = 0;
      uVar23 = 0;
      uVar46 = uVar39;
      uVar15 = uVar41;
      while( true ) {
        uVar29 = 0x40;
        if (uVar46 < 0x40) {
          uVar29 = uVar46;
        }
        uVar24 = uVar39 - uVar23;
        if (uVar39 < uVar23 || uVar24 == 0) {
          BrotliFree(m,local_ff8);
          uVar46 = (local_fb8 >> 1) * local_fb8;
          if (local_fb8 << 6 < uVar46) {
            uVar46 = local_fb8 << 6;
          }
          if (0x800 < uVar46) {
            BrotliFree(m,local_f68);
            local_f68 = (HistogramPair *)BrotliAllocate(m,uVar46 * 0x18 + 0x18);
          }
          if (local_fb8 == 0) {
            puVar9 = (uint32_t *)0x0;
          }
          else {
            puVar9 = (uint32_t *)BrotliAllocate(m,local_fb8 * 4);
          }
          for (uVar41 = 0; local_fb8 != uVar41; uVar41 = uVar41 + 1) {
            puVar9[uVar41] = (uint32_t)uVar41;
          }
          sVar7 = BrotliHistogramCombineDistance
                            (out,local_fb0,local_fe0,puVar9,local_f68,local_fb8,uVar39,0x100,uVar46)
          ;
          BrotliFree(m,local_f68);
          BrotliFree(m,local_fb0);
          if (local_fb8 == 0) {
            pvVar19 = (void *)0x0;
          }
          else {
            pvVar19 = BrotliAllocate(m,local_fb8 * 4);
          }
          for (uVar46 = 0; local_fb8 != uVar46; uVar46 = uVar46 + 1) {
            *(undefined4 *)((long)pvVar19 + uVar46 * 4) = 0xffffffff;
          }
          local_1000 = (HistogramCommand *)0x0;
          iVar31 = 0;
          for (uVar46 = 0; uVar46 != uVar39; uVar46 = uVar46 + 1) {
            memset(local_b40,0,0x828);
            local_318 = INFINITY;
            uVar41 = 0;
            while (uVar41 < *(uint *)((long)pvVar11 + uVar46 * 4)) {
              *(int *)(local_b40 +
                      (ulong)*(ushort *)((long)local_fc0 + uVar41 * 2 + (long)local_1000 * 2) * 4) =
                   *(int *)(local_b40 +
                           (ulong)*(ushort *)((long)local_fc0 + uVar41 * 2 + (long)local_1000 * 2) *
                           4) + 1;
              uVar41 = uVar41 + 1;
              local_320 = uVar41;
            }
            lVar43 = uVar46 - 1;
            if (uVar46 == 0) {
              lVar43 = 0;
            }
            uVar15 = (ulong)local_fe0[lVar43];
            local_ff0 = (HistogramCommand *)
                        BrotliHistogramBitCostDistanceDistance
                                  ((HistogramDistance *)local_b40,out + uVar15);
            local_1000 = (HistogramCommand *)((long)local_1000 + uVar41);
            for (sVar40 = 0; sVar7 != sVar40; sVar40 = sVar40 + 1) {
              dVar48 = BrotliHistogramBitCostDistanceDistance
                                 ((HistogramDistance *)local_b40,out + puVar9[sVar40]);
              if (dVar48 < (double)local_ff0) {
                uVar15 = (ulong)puVar9[sVar40];
                local_ff0 = (HistogramCommand *)dVar48;
              }
            }
            local_fe0[uVar46] = (uint32_t)uVar15;
            if (*(int *)((long)pvVar19 + uVar15 * 4) == -1) {
              *(int *)((long)pvVar19 + uVar15 * 4) = iVar31;
              iVar31 = iVar31 + 1;
            }
          }
          BrotliFree(m,puVar9);
          BrotliFree(m,out);
          uVar46 = dist_split->types_alloc_size;
          if (uVar46 < uVar39) {
            if (uVar46 == 0) {
              uVar46 = uVar39;
            }
            do {
              uVar41 = uVar46;
              uVar46 = uVar41 * 2;
            } while (uVar41 < uVar39);
            puVar8 = (uint8_t *)BrotliAllocate(m,uVar41);
            if (dist_split->types_alloc_size != 0) {
              memcpy(puVar8,dist_split->types,dist_split->types_alloc_size);
            }
            BrotliFree(m,dist_split->types);
            dist_split->types = puVar8;
            dist_split->types_alloc_size = uVar41;
          }
          uVar46 = dist_split->lengths_alloc_size;
          if (uVar46 < uVar39) {
            if (uVar46 == 0) {
              uVar46 = uVar39;
            }
            do {
              uVar41 = uVar46;
              uVar46 = uVar41 * 2;
            } while (uVar41 < uVar39);
            puVar9 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
            if (dist_split->lengths_alloc_size != 0) {
              memcpy(puVar9,dist_split->lengths,dist_split->lengths_alloc_size << 2);
            }
            BrotliFree(m,dist_split->lengths);
            dist_split->lengths = puVar9;
            dist_split->lengths_alloc_size = uVar41;
          }
          uVar46 = 0;
          uVar41 = 0;
          sVar7 = 0;
          do {
            uVar38 = 0;
            uVar15 = uVar41;
            do {
              uVar41 = uVar15 + 1;
              uVar23 = uVar46 & 0xff;
              if (uVar41 - uVar39 == 1) {
                dist_split->num_blocks = sVar7;
                dist_split->num_types = uVar23 + 1;
                BrotliFree(m,pvVar19);
                BrotliFree(m,pvVar11);
                BrotliFree(m,local_fe0);
                BrotliFree(m,pvVar17);
                goto LAB_00114226;
              }
              uVar38 = uVar38 + *(int *)((long)pvVar11 + uVar41 * 4 + -4);
              puVar33 = local_fe0 + uVar15;
            } while ((uVar41 != uVar39) && (uVar15 = uVar41, *puVar33 == local_fe0[uVar41]));
            uVar4 = *(uint *)((long)pvVar19 + (ulong)*puVar33 * 4);
            bVar5 = (byte)uVar4;
            dist_split->types[sVar7] = bVar5;
            dist_split->lengths[sVar7] = uVar38;
            bVar37 = (byte)uVar46;
            uVar46 = (ulong)uVar4;
            if (bVar5 < bVar37) {
              uVar46 = uVar23;
            }
            sVar7 = sVar7 + 1;
          } while( true );
        }
        for (uVar34 = 0; uVar34 != uVar29; uVar34 = uVar34 + 1) {
          pHVar25 = local_ff8 + uVar34;
          memset(pHVar25,0,0x828);
          local_ff8[uVar34].bit_cost_ = INFINITY;
          uVar45 = 0;
          while (uVar45 < *(uint *)((long)pvVar11 + (uVar23 + uVar34) * 4)) {
            pHVar25->data_[*(ushort *)((long)local_fc0 + uVar45 * 2 + (long)local_1000 * 2)] =
                 pHVar25->data_[*(ushort *)((long)local_fc0 + uVar45 * 2 + (long)local_1000 * 2)] +
                 1;
            uVar45 = uVar45 + 1;
            pHVar25->total_count_ = uVar45;
          }
          dVar48 = BrotliPopulationCostDistance(pHVar25);
          pHVar25->bit_cost_ = dVar48;
          new_clusters[uVar34] = (uint32_t)uVar34;
          symbols[uVar34] = (uint32_t)uVar34;
          sizes[uVar34] = 1;
          local_1000 = (HistogramCommand *)((long)local_1000 + uVar45);
        }
        if (0x3f < uVar24) {
          uVar24 = 0x40;
        }
        sVar7 = BrotliHistogramCombineDistance
                          (local_ff8,sizes,symbols,new_clusters,local_f68,uVar24,uVar24,0x40,0x800);
        uVar24 = sVar7 + local_fb8;
        if (uVar41 < uVar24) {
          uVar34 = uVar41;
          if (uVar41 == 0) {
            uVar34 = uVar24;
          }
          do {
            uVar45 = uVar34;
            uVar34 = uVar45 * 2;
          } while (uVar45 < uVar24);
          pHVar25 = (HistogramDistance *)BrotliAllocate(m,uVar45 * 0x830);
          if (uVar41 != 0) {
            memcpy(pHVar25,out,uVar41 * 0x830);
          }
          BrotliFree(m,out);
          out = pHVar25;
          uVar41 = uVar45;
        }
        if (uVar15 < uVar24) {
          uVar34 = uVar15;
          if (uVar15 == 0) {
            uVar34 = uVar24;
          }
          do {
            uVar45 = uVar34;
            uVar34 = uVar45 * 2;
          } while (uVar45 < uVar24);
          puVar9 = (uint32_t *)BrotliAllocate(m,uVar45 * 4);
          if (uVar15 != 0) {
            memcpy(puVar9,local_fb0,uVar15 << 2);
          }
          BrotliFree(m,local_fb0);
          local_fb0 = puVar9;
          uVar15 = uVar45;
        }
        pHVar25 = out + local_fb8;
        for (sVar40 = 0; sVar7 != sVar40; sVar40 = sVar40 + 1) {
          uVar4 = new_clusters[sVar40];
          memcpy(pHVar25,local_ff8 + uVar4,0x830);
          local_fb0[local_fb8 + sVar40] = sizes[uVar4];
          remap[new_clusters[sVar40]] = (uint32_t)sVar40;
          pHVar25 = pHVar25 + 1;
        }
        for (uVar34 = 0; uVar29 != uVar34; uVar34 = uVar34 + 1) {
          local_f90[uVar34] = remap[symbols[uVar34]] + (int)local_fb8;
        }
        if (sVar7 != sVar40) break;
        uVar23 = uVar23 + 0x40;
        uVar46 = uVar46 - 0x40;
        local_f90 = local_f90 + 0x40;
        local_fb8 = uVar24;
      }
      pcVar30 = 
      "void ClusterBlocksDistance(MemoryManager *, const uint16_t *, const size_t, const size_t, uint8_t *, BlockSplit *)"
      ;
LAB_0011443e:
      __assert_fail("num_clusters == cluster_size_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./block_splitter_inc.h"
                    ,0x111,pcVar30);
    }
    sVar7 = dist_split->num_blocks;
    uVar41 = dist_split->types_alloc_size;
    uVar39 = sVar7 + 1;
    if (uVar41 < uVar39) {
      if (uVar41 == 0) {
        uVar41 = uVar39;
      }
      do {
        uVar15 = uVar41;
        uVar41 = uVar15 * 2;
      } while (uVar15 < uVar39);
      puVar8 = (uint8_t *)BrotliAllocate(m,uVar15);
      if (dist_split->types_alloc_size != 0) {
        memcpy(puVar8,dist_split->types,dist_split->types_alloc_size);
      }
      BrotliFree(m,dist_split->types);
      dist_split->types = puVar8;
      dist_split->types_alloc_size = uVar15;
      sVar7 = dist_split->num_blocks;
      uVar39 = sVar7 + 1;
    }
    uVar41 = dist_split->lengths_alloc_size;
    if (uVar41 < uVar39) {
      if (uVar41 == 0) {
        uVar41 = uVar39;
      }
      do {
        uVar15 = uVar41;
        uVar41 = uVar15 * 2;
      } while (uVar15 < uVar39);
      puVar9 = (uint32_t *)BrotliAllocate(m,uVar15 * 4);
      if (dist_split->lengths_alloc_size != 0) {
        memcpy(puVar9,dist_split->lengths,dist_split->lengths_alloc_size << 2);
      }
      BrotliFree(m,dist_split->lengths);
      dist_split->lengths = puVar9;
      dist_split->lengths_alloc_size = uVar15;
      sVar7 = dist_split->num_blocks;
    }
    dist_split->num_types = 1;
    dist_split->types[sVar7] = '\0';
    sVar7 = dist_split->num_blocks;
    dist_split->lengths[sVar7] = (uint32_t)uVar46;
    dist_split->num_blocks = sVar7 + 1;
  }
LAB_00114226:
  BrotliFree(m,local_fc0);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
       Literal histograms have alphabet size 256. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}